

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  bool bVar1;
  int iVar2;
  Type TVar3;
  int iVar4;
  pointer pIVar5;
  TestEventListeners *this_00;
  TimeInMillis TVar6;
  Random *this_01;
  UnitTestImpl *this_02;
  undefined8 uVar7;
  UnitTestImpl *in_RDI;
  ReactionToSharding in_stack_0000002c;
  UnitTestImpl *in_stack_00000030;
  int j_1;
  int test_index;
  string *result;
  TestPartResult *test_part_result;
  int j;
  TestResult *test_result;
  TimeInMillis start;
  int i;
  bool gtest_repeat_forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  char *in_stack_000000c0;
  bool gtest_is_initialized_before_run_all_tests;
  UnitTestImpl *in_stack_00000290;
  UnitTestImpl *in_stack_ffffffffffffff30;
  allocator *in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff40;
  undefined3 uVar8;
  undefined4 in_stack_ffffffffffffff44;
  uint uVar9;
  UnitTestImpl *in_stack_ffffffffffffff60;
  int local_94;
  int iVar10;
  int in_stack_ffffffffffffff74;
  allocator local_79;
  string local_78 [32];
  string *local_58;
  TestPartResult *local_50;
  int local_44;
  TestResult *local_40;
  TimeInMillis local_38;
  uint local_2c;
  byte local_25;
  uint local_24;
  TestEventListener *local_20;
  byte local_15;
  byte local_14;
  undefined1 local_13;
  byte local_12;
  byte local_11;
  bool local_1;
  
  local_11 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit(in_stack_ffffffffffffff30);
    WriteToShardStatusFileIfNeeded();
    local_12 = 0;
    pIVar5 = std::
             unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
             ::get((unique_ptr<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
                    *)in_stack_ffffffffffffff30);
    local_12 = pIVar5 != (pointer)0x0;
    local_13 = ShouldShard((char *)this,in_stack_000000c0,repeater._7_1_);
    iVar2 = FilterTests(in_stack_00000030,in_stack_0000002c);
    local_14 = 0 < iVar2;
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      if ((FLAGS_gtest_shuffle & 1) == 0) {
        iVar2 = 0;
      }
      else {
        iVar2 = GetRandomSeedFromFlag((int32_t)((ulong)in_stack_ffffffffffffff30 >> 0x20));
      }
      in_RDI->random_seed_ = iVar2;
      local_15 = 0;
      this_00 = listeners(in_RDI);
      local_20 = TestEventListeners::repeater(this_00);
      TVar6 = GetTimeInMillis();
      in_RDI->start_timestamp_ = TVar6;
      (*local_20->_vptr_TestEventListener[2])(local_20,in_RDI->parent_);
      uVar9 = FLAGS_gtest_repeat;
      if ((local_12 & 1) != 0) {
        uVar9 = 1;
      }
      local_25 = (int)uVar9 < 0;
      local_2c = 0;
      local_24 = uVar9;
LAB_00142cea:
      uVar8 = (undefined3)in_stack_ffffffffffffff44;
      in_stack_ffffffffffffff44 = CONCAT13(1,uVar8);
      if ((local_25 & 1) == 0) {
        in_stack_ffffffffffffff44 = CONCAT13(local_2c != local_24,uVar8);
      }
      if ((char)((uint)in_stack_ffffffffffffff44 >> 0x18) != '\0') {
        ClearNonAdHocTestResult((UnitTestImpl *)0x142d26);
        local_38 = GetTimeInMillis();
        if (((local_14 & 1) != 0) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_01 = (Random *)random(in_RDI);
          Random::Reseed(this_01,in_RDI->random_seed_);
          ShuffleTests(in_stack_ffffffffffffff60);
        }
        (*local_20->_vptr_TestEventListener[3])(local_20,in_RDI->parent_,(ulong)local_2c);
        if ((local_14 & 1) != 0) {
          (*local_20->_vptr_TestEventListener[4])(local_20,in_RDI->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (_func_void_Environment_ptr *)in_stack_ffffffffffffff38);
          (*local_20->_vptr_TestEventListener[5])(local_20,in_RDI->parent_);
          bVar1 = Test::IsSkipped();
          if (bVar1) {
            this_02 = GetUnitTestImpl();
            local_40 = current_test_result(this_02);
            local_44 = 0;
            while (in_stack_ffffffffffffff40 = local_44,
                  iVar10 = TestResult::total_part_count((TestResult *)0x142e25),
                  in_stack_ffffffffffffff40 < iVar10) {
              local_50 = TestResult::GetTestPartResult
                                   ((TestResult *)
                                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
              TVar3 = TestPartResult::type(local_50);
              if (TVar3 == kSkip) {
                in_stack_ffffffffffffff30 =
                     (UnitTestImpl *)TestPartResult::message((TestPartResult *)0x142e72);
                in_stack_ffffffffffffff38 = &local_79;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_78,(char *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff38);
                std::allocator<char>::~allocator((allocator<char> *)&local_79);
                local_58 = local_78;
                uVar7 = std::__cxx11::string::c_str();
                printf("%s\n",uVar7);
                std::__cxx11::string::~string(local_78);
              }
              local_44 = local_44 + 1;
            }
            fflush(_stdout);
          }
          else {
            bVar1 = Test::HasFatalFailure();
            if (!bVar1) {
              iVar10 = 0;
              while (local_94 = iVar10, iVar4 = total_test_suite_count((UnitTestImpl *)0x142f6c),
                    iVar10 < iVar4) {
                GetMutableSuiteCase((UnitTestImpl *)
                                    CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                    (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
                TestSuite::Run((TestSuite *)CONCAT44(in_stack_ffffffffffffff74,local_94));
                if ((FLAGS_gtest_fail_fast & 1) != 0) {
                  GetMutableSuiteCase((UnitTestImpl *)
                                      CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                      (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
                  bVar1 = TestSuite::Failed((TestSuite *)in_stack_ffffffffffffff30);
                  if (bVar1) goto LAB_00142fc0;
                }
                iVar10 = local_94 + 1;
              }
            }
          }
          goto LAB_00143015;
        }
        goto LAB_00143085;
      }
      (*local_20->_vptr_TestEventListener[0x10])(local_20,in_RDI->parent_);
      if ((local_11 & 1) == 0) {
        ColoredPrintf(kRed,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      local_1 = (bool)((local_15 ^ 0xff) & 1);
    }
    else {
      ListTestsMatchingFilter(in_stack_00000290);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
LAB_00142fc0:
  while( true ) {
    local_94 = local_94 + 1;
    iVar10 = total_test_suite_count((UnitTestImpl *)0x142fd1);
    if (iVar10 <= local_94) break;
    GetMutableSuiteCase((UnitTestImpl *)
                        CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                        (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    TestSuite::Skip((TestSuite *)in_RDI);
  }
LAB_00143015:
  (*local_20->_vptr_TestEventListener[0xd])(local_20,in_RDI->parent_);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             in_stack_ffffffffffffff38);
  std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
            ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
             in_stack_ffffffffffffff38);
  __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)in_RDI,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
              *)CONCAT44(iVar2,uVar9),
             (_func_void_Environment_ptr *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  (*local_20->_vptr_TestEventListener[0xe])(local_20,in_RDI->parent_);
LAB_00143085:
  TVar6 = GetTimeInMillis();
  in_RDI->elapsed_time_ = TVar6 - local_38;
  (*local_20->_vptr_TestEventListener[0xf])(local_20,in_RDI->parent_,(ulong)local_2c);
  bVar1 = Passed((UnitTestImpl *)0x1430c4);
  if (!bVar1) {
    local_15 = 1;
  }
  UnshuffleTests((UnitTestImpl *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if ((FLAGS_gtest_shuffle & 1) != 0) {
    iVar10 = GetNextRandomSeed(in_stack_ffffffffffffff74);
    in_RDI->random_seed_ = iVar10;
  }
  local_2c = local_2c + 1;
  goto LAB_00142cea;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True if and only if Google Test is initialized before RUN_ALL_TESTS() is
  // called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True if and only if we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test =
      (internal_run_death_test_flag_.get() != nullptr);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True if and only if at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool gtest_repeat_forever = repeat < 0;
  for (int i = 0; gtest_repeat_forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test suites and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(static_cast<uint32_t>(random_seed_));
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test suite if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure or skip triggered
      // during global set-up.
      if (Test::IsSkipped()) {
        // Emit diagnostics when global set-up calls skip, as it will not be
        // emitted by default.
        TestResult& test_result =
            *internal::GetUnitTestImpl()->current_test_result();
        for (int j = 0; j < test_result.total_part_count(); ++j) {
          const TestPartResult& test_part_result =
              test_result.GetTestPartResult(j);
          if (test_part_result.type() == TestPartResult::kSkip) {
            const std::string& result = test_part_result.message();
            printf("%s\n", result.c_str());
          }
        }
        fflush(stdout);
      } else if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_suite_count();
             test_index++) {
          GetMutableSuiteCase(test_index)->Run();
          if (GTEST_FLAG(fail_fast) &&
              GetMutableSuiteCase(test_index)->Failed()) {
            for (int j = test_index + 1; j < total_test_suite_count(); j++) {
              GetMutableSuiteCase(j)->Skip();
            }
            break;
          }
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        GTestColor::kRed,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(GTestColor::kRed,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}